

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

void Eigen::internal::
     outer_product_selector_run<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>const>,Eigen::internal::generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>const>,Eigen::DenseShape,Eigen::DenseShape,5>::sub>
               (Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>
                *dst,CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                     *lhs,
               Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>
               *rhs,sub *func,false_type *param_5)

{
  long lVar1;
  sub *this;
  Scalar *ptr;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *xpr;
  Index IVar2;
  undefined1 *puVar3;
  undefined1 auStack_1a8 [8];
  CoeffReturnType local_1a0;
  sub *local_198;
  Scalar *local_190;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *local_188;
  CoeffReturnType local_180;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_>_>
  local_178;
  ColXpr local_138;
  long local_a0;
  Index j;
  Index cols;
  ObjectType actual_lhs;
  undefined1 local_68 [8];
  local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,__1,_true>
  actual_lhs_wrapper;
  evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>_>
  rhsEval;
  false_type *param_4_local;
  sub *func_local;
  Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>
  *rhs_local;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *lhs_local;
  Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>
  *dst_local;
  
  puVar3 = auStack_1a8;
  evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>_>
  ::evaluator((evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>_>
               *)&actual_lhs_wrapper.m_deallocate,rhs);
  local_188 = lhs;
  IVar2 = EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
          ::size((EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)lhs);
  if ((ulong)(IVar2 * 8) < 0x20001) {
    IVar2 = EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
            ::size((EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                    *)lhs);
    lVar1 = -(IVar2 * 8 + 0x1eU & 0xfffffffffffffff0);
    puVar3 = auStack_1a8 + lVar1;
    local_190 = (Scalar *)((long)&local_1a0 + lVar1);
  }
  else {
    local_190 = (Scalar *)0x0;
  }
  xpr = local_188;
  ptr = local_190;
  *(undefined8 *)(puVar3 + -8) = 0x1e9ef1;
  local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_-1,_true>
  ::local_nested_eval_wrapper
            ((local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,__1,_true>
              *)local_68,xpr,ptr);
  *(undefined8 *)(puVar3 + -8) = 0x1e9f03;
  Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_16,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_> *)&cols,
             (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_16,_Eigen::Stride<0,_0>_> *)local_68);
  *(undefined8 *)(puVar3 + -8) = 0x1e9f0e;
  j = MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>,_0>
      ::cols((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
              *)dst);
  for (local_a0 = 0; lVar1 = local_a0, local_a0 < j; local_a0 = local_a0 + 1) {
    local_198 = func;
    *(undefined8 *)(puVar3 + -8) = 0x1e9f56;
    DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_-1,_false>_>
    ::col(&local_138,
          (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>_>
           *)dst,lVar1);
    lVar1 = local_a0;
    *(undefined8 *)(puVar3 + -8) = 0x1e9f6c;
    local_1a0 = unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>,_Eigen::internal::IndexBased,_double>
                ::coeff((unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_double>
                         *)&actual_lhs_wrapper.m_deallocate,0,lVar1);
    local_180 = local_1a0;
    *(undefined8 *)(puVar3 + -8) = 0x1e9fa0;
    Eigen::operator*(&local_178,&local_180,(StorageBaseType *)&cols);
    this = local_198;
    *(undefined8 *)(puVar3 + -8) = 0x1e9fbc;
    generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,false>const>,Eigen::DenseShape,Eigen::DenseShape,5>
    ::sub::operator()(this,&local_138,&local_178);
  }
  *(undefined8 *)(puVar3 + -8) = 0x1ea005;
  local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_-1,_true>
  ::~local_nested_eval_wrapper
            ((local_nested_eval_wrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,__1,_true>
              *)local_68);
  *(undefined8 *)(puVar3 + -8) = 0x1ea00e;
  evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_false>_>_>
  ::~evaluator((evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>_>
                *)&actual_lhs_wrapper.m_deallocate);
  return;
}

Assistant:

void EIGEN_DEVICE_FUNC outer_product_selector_run(Dst& dst, const Lhs &lhs, const Rhs &rhs, const Func& func, const false_type&)
{
  evaluator<Rhs> rhsEval(rhs);
  ei_declare_local_nested_eval(Lhs,lhs,Rhs::SizeAtCompileTime,actual_lhs);
  // FIXME if cols is large enough, then it might be useful to make sure that lhs is sequentially stored
  // FIXME not very good if rhs is real and lhs complex while alpha is real too
  const Index cols = dst.cols();
  for (Index j=0; j<cols; ++j)
    func(dst.col(j), rhsEval.coeff(Index(0),j) * actual_lhs);
}